

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::DragBehaviorT<unsigned_long_long,long_long,double>
               (ImGuiDataType data_type,unsigned_long_long *v,float v_speed,unsigned_long_long v_min
               ,unsigned_long_long v_max,char *format,float power,ImGuiDragFlags flags)

{
  bool bVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ImGuiContext *pIVar7;
  bool bVar8;
  ImGuiInputSource IVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar18 [16];
  double dVar19;
  double dVar20;
  undefined4 in_XMM0_Db;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 in_ZMM2 [64];
  undefined4 in_XMM5_Da;
  undefined1 in_register_00001344 [12];
  undefined1 local_78 [16];
  undefined8 local_38;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [56];
  
  pIVar7 = GImGui;
  uVar13 = data_type & 0xfffffffe;
  if (v_max < v_min) {
    return false;
  }
  if (v_speed == 0.0 && (v_min <= v_max && v_max - v_min != 0)) {
    auVar18 = vcvtusi2ss_avx512f(in_ZMM2._0_16_,v_max - v_min);
    v_speed = auVar18._0_4_ * GImGui->DragSpeedDefaultRatio;
    in_XMM0_Db = 0;
    in_XMM0_Dc = 0;
    in_XMM0_Dd = 0;
  }
  IVar9 = GImGui->ActiveIdSource;
  uVar14 = flags & 1;
  local_78._4_4_ = in_XMM0_Db;
  local_78._0_4_ = v_speed;
  local_78._8_4_ = in_XMM0_Dc;
  local_78._12_4_ = in_XMM0_Dd;
  if (IVar9 == ImGuiInputSource_Mouse) {
    bVar8 = IsMousePosValid((ImVec2 *)0x0);
    if ((!bVar8) || ((pIVar7->IO).MouseDragMaxDistanceSqr[0] <= 1.0)) {
      IVar9 = pIVar7->ActiveIdSource;
      goto LAB_00262428;
    }
    fVar16 = (pIVar7->IO).NavInputs[(ulong)uVar14 + 0x1d];
    bVar8 = (pIVar7->IO).KeyShift;
    bVar1 = (pIVar7->IO).KeyAlt;
    fVar16 = (float)((uint)(bVar1 & 1) * (int)(fVar16 * 0.01) +
                    (uint)!(bool)(bVar1 & 1) * (int)fVar16);
    fVar16 = (float)((uint)(bVar8 & 1) * (int)(fVar16 * 10.0) +
                    (uint)!(bool)(bVar8 & 1) * (int)fVar16);
  }
  else {
LAB_00262428:
    fVar16 = 0.0;
    if (IVar9 == ImGuiInputSource_Nav) {
      uVar10 = 0;
      if (uVar13 == 8) {
        uVar10 = ImParseFormatPrecision(format,3);
      }
      auVar21._0_8_ = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.1,10.0);
      auVar21._8_56_ = extraout_var_00;
      local_38 = vmovlps_avx(auVar21._0_16_);
      fVar16 = *(float *)((long)&local_38 + (ulong)uVar14 * 4);
      if ((int)uVar10 < 0) {
        auVar18 = SUB6416(ZEXT464(0x800000),0);
      }
      else if (uVar10 < 10) {
        auVar18 = ZEXT416(*(uint *)(GetMinimumStepAtDecimalPrecision(int)::min_steps +
                                   (ulong)uVar10 * 4));
      }
      else {
        auVar22._0_4_ = powf(10.0,(float)(int)-uVar10);
        auVar22._4_60_ = extraout_var;
        auVar18 = auVar22._0_16_;
      }
      uVar2 = vcmpss_avx512f(auVar18,local_78,2);
      bVar8 = (bool)((byte)uVar2 & 1);
      v_speed = (float)((uint)bVar8 * (int)v_speed + (uint)!bVar8 * auVar18._0_4_);
    }
  }
  fVar16 = fVar16 * v_speed;
  auVar18._8_4_ = 0x80000000;
  auVar18._0_8_ = 0x8000000080000000;
  auVar18._12_4_ = 0x80000000;
  auVar18 = vxorps_avx512vl(ZEXT416((uint)fVar16),auVar18);
  lVar15 = v_max - v_min;
  fVar17 = (float)((uint)(uVar14 == 0) * (int)fVar16 + (uint)(uVar14 != 0) * auVar18._0_4_);
  if (v_max < v_min || lVar15 == 0) {
    bVar8 = false;
LAB_00262576:
    bVar1 = false;
  }
  else {
    if ((*v < v_max) || (bVar8 = true, fVar17 <= 0.0)) {
      bVar8 = fVar17 < 0.0 && *v <= v_min;
    }
    if ((v_max <= v_min || uVar13 != 8) || power == 1.0) goto LAB_00262576;
    if ((fVar17 < 0.0) && (0.0 < pIVar7->DragCurrentAccum)) goto LAB_002625aa;
    if (fVar17 <= 0.0) goto LAB_00262576;
    bVar1 = pIVar7->DragCurrentAccum < 0.0;
  }
  if (((pIVar7->ActiveIdIsJustActivated == false) && (!bVar8)) && (!bVar1)) {
    if ((fVar16 != 0.0) || (NAN(fVar16))) {
      pIVar7->DragCurrentAccum = fVar17 + pIVar7->DragCurrentAccum;
      pIVar7->DragCurrentAccumDirty = true;
    }
    else if ((pIVar7->DragCurrentAccumDirty & 1U) == 0) {
      return false;
    }
    if ((v_max <= v_min || uVar13 != 8) || power == 1.0) {
      uVar11 = RoundScalarWithFormatT<unsigned_long_long,long_long>
                         (format,data_type,*v + (long)pIVar7->DragCurrentAccum);
      pIVar7->DragCurrentAccumDirty = false;
      uVar12 = *v;
      pIVar7->DragCurrentAccum = pIVar7->DragCurrentAccum - (float)(long)(uVar11 - uVar12);
    }
    else {
      auVar3._4_12_ = in_register_00001344;
      auVar3._0_4_ = in_XMM5_Da;
      auVar18 = vcvtusi2sd_avx512f(auVar3,*v - v_min);
      auVar4._4_12_ = in_register_00001344;
      auVar4._0_4_ = in_XMM5_Da;
      auVar3 = vcvtusi2sd_avx512f(auVar4,lVar15);
      dVar19 = pow(auVar18._0_8_ / auVar3._0_8_,1.0 / (double)power);
      auVar5._4_12_ = in_register_00001344;
      auVar5._0_4_ = in_XMM5_Da;
      auVar18 = vcvtusi2ss_avx512f(auVar5,lVar15);
      auVar24._0_12_ = ZEXT812(0);
      auVar24._12_4_ = 0;
      dVar20 = dVar19 + (double)(pIVar7->DragCurrentAccum / auVar18._0_4_);
      auVar23._0_4_ = (float)dVar20;
      auVar23._4_4_ = (int)((ulong)dVar20 >> 0x20);
      auVar23._8_8_ = 0;
      uVar2 = vcmpss_avx512f(auVar23,auVar24,1);
      auVar18 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar23);
      fVar16 = powf((float)((uint)!(bool)((byte)uVar2 & 1) * auVar18._0_4_),power);
      uVar11 = RoundScalarWithFormatT<unsigned_long_long,long_long>
                         (format,data_type,(long)fVar16 * lVar15 + v_min);
      pIVar7->DragCurrentAccumDirty = false;
      auVar6._4_12_ = in_register_00001344;
      auVar6._0_4_ = in_XMM5_Da;
      auVar18 = vcvtusi2sd_avx512f(auVar6,uVar11 - v_min);
      dVar20 = pow(auVar18._0_8_ / auVar3._0_8_,1.0 / (double)power);
      pIVar7->DragCurrentAccum = pIVar7->DragCurrentAccum - (float)(dVar20 - dVar19);
      uVar12 = *v;
    }
    if ((v_min < v_max) && (uVar12 != uVar11)) {
      if ((uVar11 < v_min) || (((uVar13 != 8 && (uVar12 < uVar11)) && (fVar17 < 0.0)))) {
        uVar11 = v_min;
      }
      if ((v_max < uVar11) || (((uVar13 != 8 && (uVar11 < uVar12)) && (0.0 < fVar17)))) {
        uVar11 = v_max;
      }
    }
    if (uVar12 == uVar11) {
      return false;
    }
    *v = uVar11;
    return true;
  }
LAB_002625aa:
  pIVar7->DragCurrentAccum = 0.0;
  pIVar7->DragCurrentAccumDirty = false;
  return false;
}

Assistant:

bool ImGui::DragBehaviorT(ImGuiDataType data_type, TYPE* v, float v_speed, const TYPE v_min, const TYPE v_max, const char* format, float power, ImGuiDragFlags flags)
{
    ImGuiContext& g = *GImGui;
    const ImGuiAxis axis = (flags & ImGuiDragFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const bool is_clamped = (v_min < v_max);
    const bool is_power = (power != 1.0f && is_decimal && is_clamped && (v_max - v_min < FLT_MAX));
    const bool is_locked = (v_min > v_max);
    if (is_locked)
        return false;

    // Default tweak speed
    if (v_speed == 0.0f && is_clamped && (v_max - v_min < FLT_MAX))
        v_speed = (float)((v_max - v_min) * g.DragSpeedDefaultRatio);

    // Inputs accumulates into g.DragCurrentAccum, which is flushed into the current value as soon as it makes a difference with our precision settings
    float adjust_delta = 0.0f;
    if (g.ActiveIdSource == ImGuiInputSource_Mouse && IsMousePosValid() && g.IO.MouseDragMaxDistanceSqr[0] > 1.0f*1.0f)
    {
        adjust_delta = g.IO.MouseDelta[axis];
        if (g.IO.KeyAlt)
            adjust_delta *= 1.0f / 100.0f;
        if (g.IO.KeyShift)
            adjust_delta *= 10.0f;
    }
    else if (g.ActiveIdSource == ImGuiInputSource_Nav)
    {
        int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 0;
        adjust_delta = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 1.0f / 10.0f, 10.0f)[axis];
        v_speed = ImMax(v_speed, GetMinimumStepAtDecimalPrecision(decimal_precision));
    }
    adjust_delta *= v_speed;

    // For vertical drag we currently assume that Up=higher value (like we do with vertical sliders). This may become a parameter.
    if (axis == ImGuiAxis_Y)
        adjust_delta = -adjust_delta;

    // Clear current value on activation
    // Avoid altering values and clamping when we are _already_ past the limits and heading in the same direction, so e.g. if range is 0..255, current value is 300 and we are pushing to the right side, keep the 300.
    bool is_just_activated = g.ActiveIdIsJustActivated;
    bool is_already_past_limits_and_pushing_outward = is_clamped && ((*v >= v_max && adjust_delta > 0.0f) || (*v <= v_min && adjust_delta < 0.0f));
    bool is_drag_direction_change_with_power = is_power && ((adjust_delta < 0 && g.DragCurrentAccum > 0) || (adjust_delta > 0 && g.DragCurrentAccum < 0));
    if (is_just_activated || is_already_past_limits_and_pushing_outward || is_drag_direction_change_with_power)
    {
        g.DragCurrentAccum = 0.0f;
        g.DragCurrentAccumDirty = false;
    }
    else if (adjust_delta != 0.0f)
    {
        g.DragCurrentAccum += adjust_delta;
        g.DragCurrentAccumDirty = true;
    }

    if (!g.DragCurrentAccumDirty)
        return false;

    TYPE v_cur = *v;
    FLOATTYPE v_old_ref_for_accum_remainder = (FLOATTYPE)0.0f;

    if (is_power)
    {
        // Offset + round to user desired precision, with a curve on the v_min..v_max range to get more precision on one side of the range
        FLOATTYPE v_old_norm_curved = ImPow((FLOATTYPE)(v_cur - v_min) / (FLOATTYPE)(v_max - v_min), (FLOATTYPE)1.0f / power);
        FLOATTYPE v_new_norm_curved = v_old_norm_curved + (g.DragCurrentAccum / (v_max - v_min));
        v_cur = v_min + (SIGNEDTYPE)ImPow(ImSaturate((float)v_new_norm_curved), power) * (v_max - v_min);
        v_old_ref_for_accum_remainder = v_old_norm_curved;
    }
    else
    {
        v_cur += (SIGNEDTYPE)g.DragCurrentAccum;
    }

    // Round to user desired precision based on format string
    v_cur = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_cur);

    // Preserve remainder after rounding has been applied. This also allow slow tweaking of values.
    g.DragCurrentAccumDirty = false;
    if (is_power)
    {
        FLOATTYPE v_cur_norm_curved = ImPow((FLOATTYPE)(v_cur - v_min) / (FLOATTYPE)(v_max - v_min), (FLOATTYPE)1.0f / power);
        g.DragCurrentAccum -= (float)(v_cur_norm_curved - v_old_ref_for_accum_remainder);
    }
    else
    {
        g.DragCurrentAccum -= (float)((SIGNEDTYPE)v_cur - (SIGNEDTYPE)*v);
    }

    // Lose zero sign for float/double
    if (v_cur == (TYPE)-0)
        v_cur = (TYPE)0;

    // Clamp values (+ handle overflow/wrap-around for integer types)
    if (*v != v_cur && is_clamped)
    {
        if (v_cur < v_min || (v_cur > *v && adjust_delta < 0.0f && !is_decimal))
            v_cur = v_min;
        if (v_cur > v_max || (v_cur < *v && adjust_delta > 0.0f && !is_decimal))
            v_cur = v_max;
    }

    // Apply result
    if (*v == v_cur)
        return false;
    *v = v_cur;
    return true;
}